

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapms.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint in_EAX;
  int iVar1;
  int cnum;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    uStack_38 = (ulong)(uint)uStack_38;
    do {
      while (iVar1 = getopt(argc,argv,"c:"), iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",(long)&uStack_38 + 4);
      }
    } while (iVar1 != -1);
    if (uStack_38._4_4_ < nva_cardsnum) {
      timing_pms_waits(uStack_38._4_4_);
      return 0;
    }
    if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	timing_pms_waits(cnum);

	return 0;
}